

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_member_reference_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t param_1,SPIRType *type,
          uint32_t index,bool param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string local_30;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)index;
  to_member_name_abi_cxx11_(&local_30,this,type,index);
  join<char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)0x345038,(char (*) [2])&local_30,ts_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_member_reference(uint32_t, const SPIRType &type, uint32_t index, bool)
{
	return join(".", to_member_name(type, index));
}